

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.c
# Opt level: O2

void Node_compile_c_ko(Node *node,int ko)

{
  Node *pNVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  code *pcVar7;
  long lVar8;
  uint uVar9;
  char *__format;
  undefined1 *__s;
  Node **ppNVar10;
  int iVar11;
  uchar *local_70;
  uint local_64;
  FILE *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  iVar11 = yyl_prev;
  if (node == (Node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/compile.c"
                  ,0xb1,"void Node_compile_c_ko(Node *, int)");
  }
  switch(node->type) {
  case 1:
    fprintf(_stderr,"\ninternal error #1 (%s)\n",(node->rule).name);
    goto LAB_001052b5;
  default:
    fprintf(_stderr,"\nNode_compile_c_ko: illegal node type %d\n");
LAB_001052b5:
    exit(1);
  case 3:
    fprintf((FILE *)output,"  if (!yy_%s(G)) ",*(undefined8 *)((node->rule).name + 0x18));
    if ((node->rule).errblock == (char *)0x0) {
      pcVar4 = " goto l%d;\n";
    }
    else {
      fwrite("{ ",2,1,(FILE *)output);
      fprintf((FILE *)output,
              " { YY_XTYPE YY_XVAR = (YY_XTYPE) G->data; int yyindex = G->offset + G->pos; %s; }",
              (node->rule).errblock);
      pcVar4 = " goto l%d; }\n";
    }
    fprintf((FILE *)output,pcVar4,(ulong)(uint)ko);
    if ((node->rule).variables == (Node *)0x0) {
      return;
    }
    uVar5 = (ulong)(uint)(((node->rule).variables)->variable).offset;
    pcVar4 = "  yyDo(G, yySet, %d, 0, \"yySet\");\n";
    goto LAB_0010523c;
  case 4:
    pcVar4 = "  if (!yymatchDot(G)) goto l%d;";
LAB_00104ee7:
    uVar5 = (ulong)(uint)ko;
LAB_0010523c:
    fprintf((FILE *)output,pcVar4,uVar5);
    return;
  case 5:
  case 6:
    pcVar4 = (node->rule).name;
    sVar3 = strlen(pcVar4);
    if ((int)sVar3 == 2) {
      if (*pcVar4 == '\\') {
LAB_00105106:
        __format = "  if (!yymatchChar(G, \'%s\')) goto l%d;\n";
        goto LAB_00105123;
      }
    }
    else if ((int)sVar3 == 1) {
      if (*pcVar4 != '\'') goto LAB_00105106;
      pcVar4 = "  if (!yymatchChar(G, \'\\\'\')) goto l%d;\n";
      goto LAB_00104ee7;
    }
    __format = "  if (!yymatchString(G, \"%s\")) goto l%d;\n";
LAB_00105123:
    fprintf((FILE *)output,__format,pcVar4,(ulong)(uint)ko);
    return;
  case 7:
    local_70 = (uchar *)(node->rule).name;
    local_60 = (FILE *)output;
    if (*local_70 == '^') {
      local_48._8_4_ = 0xffffffff;
      local_48._0_8_ = 0xffffffffffffffff;
      local_48._12_4_ = 0xffffffff;
      local_58._8_4_ = 0xffffffff;
      local_58._0_8_ = 0xffffffffffffffff;
      local_58._12_4_ = 0xffffffff;
      local_70 = local_70 + 1;
      pcVar7 = charClassClear;
    }
    else {
      local_48 = (undefined1  [16])0x0;
      local_58 = (undefined1  [16])0x0;
      pcVar7 = charClassSet;
    }
    local_64 = ko;
    uVar9 = 0xffffffff;
    do {
      while (uVar2 = readChar(&local_70), (char)uVar2 != '-') {
        if ((uVar2 & 0xff) == 0) {
          __s = makeCharClass_string;
          for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 1) {
            iVar11 = sprintf(__s,"\\%03o",(ulong)(byte)local_58[lVar8]);
            __s = __s + iVar11;
          }
          pcVar4 = yyqq((node->rule).name);
          fprintf(local_60,
                  "  if (!yymatchClass(G, (const unsigned char *)\"%s\", \"%s\")) goto l%d;\n",
                  makeCharClass_string,pcVar4,(ulong)local_64);
          return;
        }
LAB_00105178:
        (*pcVar7)(local_58,uVar2);
        uVar9 = uVar2;
      }
      if (((int)uVar9 < 0) || (*local_70 == '\0')) goto LAB_00105178;
      iVar11 = readChar(&local_70);
      for (; (int)uVar9 <= iVar11; uVar9 = uVar9 + 1) {
        (*pcVar7)(local_58,uVar9);
      }
      uVar9 = 0xffffffff;
    } while( true );
  case 8:
    fprintf((FILE *)output,"  yyDo(G, yy%s, G->begin, G->end, \"yy%s\");\n",(node->rule).expression)
    ;
    return;
  case 9:
    pcVar4 = (node->rule).name;
    __format = "  yyText(G, G->begin, G->end);  if (!(%s)) goto l%d;";
    goto LAB_00105123;
  case 10:
    iVar6 = yyl_prev + 1;
    yyl_prev = iVar6;
    begin();
    save(iVar6);
    ppNVar10 = &(node->name).rule;
    while (pNVar1 = *ppNVar10, pNVar1 != (Node *)0x0) {
      ppNVar10 = &(pNVar1->rule).next;
      if ((pNVar1->rule).next == (Node *)0x0) {
        Node_compile_c_ko(pNVar1,ko);
      }
      else {
        iVar11 = yyl_prev + 1;
        yyl_prev = iVar11;
        Node_compile_c_ko(pNVar1,iVar11);
        jump(iVar6);
        label(iVar11);
        restore(iVar6);
      }
    }
    end();
    goto LAB_0010504a;
  case 0xb:
    ppNVar10 = &(node->name).rule;
    while (pNVar1 = *ppNVar10, pNVar1 != (Node *)0x0) {
      Node_compile_c_ko(pNVar1,ko);
      ppNVar10 = &(pNVar1->rule).next;
    }
    return;
  case 0xc:
    iVar6 = yyl_prev + 1;
    yyl_prev = iVar6;
    begin();
    save(iVar6);
    Node_compile_c_ko((node->name).rule,ko);
    break;
  case 0xd:
    iVar6 = yyl_prev + 1;
    yyl_prev = iVar6;
    begin();
    save(iVar6);
    Node_compile_c_ko((node->name).rule,iVar6);
    jump(ko);
    label(iVar6);
    break;
  case 0xe:
    iVar11 = yyl_prev + 1;
    iVar6 = yyl_prev + 2;
    yyl_prev = iVar6;
    begin();
    save(iVar11);
    Node_compile_c_ko((node->name).rule,iVar11);
    jump(iVar6);
    label(iVar11);
    restore(iVar11);
    end();
LAB_0010504a:
    label(iVar6);
    return;
  case 0xf:
    iVar6 = yyl_prev + 1;
    iVar11 = yyl_prev + 2;
    yyl_prev = iVar11;
    label(iVar6);
    begin();
    save(iVar11);
    Node_compile_c_ko((node->name).rule,iVar11);
    jump(iVar6);
    label(iVar11);
    goto LAB_001050de;
  case 0x10:
    iVar6 = yyl_prev + 1;
    iVar11 = yyl_prev + 2;
    yyl_prev = iVar11;
    Node_compile_c_ko((node->name).rule,ko);
    label(iVar6);
    begin();
    save(iVar11);
    Node_compile_c_ko((node->name).rule,iVar11);
    jump(iVar6);
    label(iVar11);
    goto LAB_001050de;
  }
  iVar11 = iVar11 + 1;
LAB_001050de:
  restore(iVar11);
  end();
  return;
}

Assistant:

static void Node_compile_c_ko(Node *node, int ko)
{
  assert(node);
  switch (node->type)
    {
    case Rule:
      fprintf(stderr, "\ninternal error #1 (%s)\n", node->rule.name);
      exit(1);
      break;

    case Dot:
      fprintf(output, "  if (!yymatchDot(G)) goto l%d;", ko);
      break;

    case Name:
      fprintf(output, "  if (!yy_%s(G)) ", node->name.rule->rule.name);
      if(((struct Any*) node)->errblock) {
	fprintf(output, "{ ");
	callErrBlock(node);
	fprintf(output, " goto l%d; }\n", ko);
      } else {
	fprintf(output, " goto l%d;\n", ko);
      }
      if (node->name.variable)
	fprintf(output, "  yyDo(G, yySet, %d, 0, \"yySet\");\n", node->name.variable->variable.offset);
      break;

    case Character:
    case String:
      {
	int len= strlen(node->string.value);
	if (1 == len)
	  {
	    if ('\'' == node->string.value[0])
	      fprintf(output, "  if (!yymatchChar(G, '\\'')) goto l%d;\n", ko);
	    else
	      fprintf(output, "  if (!yymatchChar(G, '%s')) goto l%d;\n", node->string.value, ko);
	  }
	else
	  if (2 == len && '\\' == node->string.value[0])
	    fprintf(output, "  if (!yymatchChar(G, '%s')) goto l%d;\n", node->string.value, ko);
	  else
	    fprintf(output, "  if (!yymatchString(G, \"%s\")) goto l%d;\n", node->string.value, ko);
      }
      break;

    case Class:
      fprintf(output, "  if (!yymatchClass(G, (const unsigned char *)\"%s\", \"%s\")) goto l%d;\n", makeCharClass(node->cclass.value), yyqq((char*)node->cclass.value), ko);
      break;

    case Action:
      fprintf(output, "  yyDo(G, yy%s, G->begin, G->end, \"yy%s\");\n", node->action.name, node->action.name);
      break;

    case Predicate:
      fprintf(output, "  yyText(G, G->begin, G->end);  if (!(%s)) goto l%d;", node->action.text, ko);
      break;

    case Alternate:
      {
        int ok= yyl();
        begin();
        save(ok);
        for (node= node->alternate.first;  node;  node= node->alternate.next)
          if (node->alternate.next)
            {
              int next= yyl();
              Node_compile_c_ko(node, next);
              jump(ok);
              label(next);
              restore(ok);
            }
          else
            Node_compile_c_ko(node, ko);
        end();
        label(ok);
      }
      break;

    case Sequence:
      for (node= node->sequence.first;  node;  node= node->sequence.next)
        Node_compile_c_ko(node, ko);
      break;

    case PeekFor:
      {
        int ok= yyl();
        begin();
        save(ok);
        Node_compile_c_ko(node->peekFor.element, ko);
        restore(ok);
        end();
      }
      break;

    case PeekNot:
      {
        int ok= yyl();
        begin();
        save(ok);
        Node_compile_c_ko(node->peekFor.element, ok);
        jump(ko);
        label(ok);
        restore(ok);
        end();
      }
      break;

    case Query:
      {
        int qko= yyl(), qok= yyl();
        begin();
        save(qko);
        Node_compile_c_ko(node->query.element, qko);
        jump(qok);
        label(qko);
        restore(qko);
        end();
        label(qok);
      }
      break;

    case Star:
      {
        int again= yyl(), out= yyl();
        label(again);
        begin();
        save(out);
        Node_compile_c_ko(node->star.element, out);
        jump(again);
        label(out);
        restore(out);
        end();
      }
      break;

    case Plus:
      {
        int again= yyl(), out= yyl();
        Node_compile_c_ko(node->plus.element, ko);
        label(again);
        begin();
        save(out);
        Node_compile_c_ko(node->plus.element, out);
        jump(again);
        label(out);
        restore(out);
        end();
      }
      break;

    default:
      fprintf(stderr, "\nNode_compile_c_ko: illegal node type %d\n", node->type);
      exit(1);
    }
}